

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Performance::anon_unknown_1::OperatorPerformanceCase::prepareProgram
          (OperatorPerformanceCase *this,int progNdx)

{
  Vec4 *pVVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  float fVar2;
  int iVar3;
  ShaderProgram *pSVar4;
  pointer puVar5;
  pointer puVar6;
  Vec4 *pVVar7;
  Vec4 *pVVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 extraout_var;
  Vec4 *pVVar12;
  Vec4 *pVVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int compNdx_3;
  int compNdx;
  long lVar18;
  ulong uVar19;
  pointer pAVar20;
  uint uVar21;
  size_type __new_size;
  uint uVar22;
  uint uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  attributes;
  vector<float,_std::allocator<float>_> vertices;
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  local_f0;
  AttribSpec local_d8;
  Vec4 local_78;
  Vec4 local_68;
  Vec4 local_58;
  Vec4 local_48;
  long lVar11;
  
  iVar9 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar9);
  pSVar4 = (this->m_programs).
           super__Vector_base<de::SharedPtr<glu::ShaderProgram>,_std::allocator<de::SharedPtr<glu::ShaderProgram>_>_>
           ._M_impl.super__Vector_impl_data._M_start[progNdx].m_ptr;
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::vector(&local_f0,
           &(this->m_programData).
            super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
            ._M_impl.super__Vector_impl_data._M_start[progNdx].attributes);
  local_48.m_data[0] = -1.0;
  local_48.m_data[1] = -1.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 1.0;
  local_58.m_data[1] = -1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = -1.0;
  local_68.m_data[1] = 1.0;
  local_68.m_data[2] = 0.0;
  local_68.m_data[3] = 1.0;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  AttribSpec::AttribSpec(&local_d8,"a_position",&local_48,&local_58,&local_68,&local_78);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::push_back(&local_f0,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8.name._M_dataplus._M_p != &local_d8.name.field_2) {
    operator_delete(local_d8.name._M_dataplus._M_p,local_d8.name.field_2._M_allocated_capacity + 1);
  }
  puVar5 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_attribBuffers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar5 != puVar6) {
    (**(code **)(lVar11 + 0x438))((ulong)((long)puVar6 - (long)puVar5) >> 2);
  }
  this_00 = &this->m_attribBuffers;
  __new_size = ((long)local_f0.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f0.
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555;
  local_d8.name._M_dataplus._M_p = (pointer)((ulong)local_d8.name._M_dataplus._M_p._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this_00,__new_size,(value_type_conflict2 *)&local_d8);
  (**(code **)(lVar11 + 0x6c8))
            ((ulong)((long)(this->m_attribBuffers).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_attribBuffers).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"glGenBuffers()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x286);
  uVar21 = (uint)__new_size;
  if (0 < (int)uVar21) {
    pVVar13 = &(local_f0.
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start)->p10;
    uVar19 = 0;
    do {
      local_d8.name._M_dataplus._M_p = (pointer)0x0;
      local_d8.name._M_string_length = 0;
      local_d8.name.field_2._M_allocated_capacity = 0;
      iVar9 = this->m_gridSizeX;
      iVar3 = this->m_gridSizeY;
      std::vector<float,_std::allocator<float>_>::resize
                ((vector<float,_std::allocator<float>_> *)&local_d8,(long)(iVar9 * iVar3 * 0x18));
      if (0 < iVar3) {
        pVVar1 = &local_f0.
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar19].p11;
        pVVar12 = &local_f0.
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar19].p00;
        iVar14 = 0;
        iVar15 = 0;
        do {
          if (0 < iVar9) {
            fVar32 = (float)iVar15 / (float)iVar3;
            fVar24 = (float)(iVar15 + 1) / (float)iVar3;
            iVar16 = 0;
            do {
              fVar28 = (float)iVar16 / (float)iVar9;
              fVar29 = fVar32 + fVar28;
              fVar26 = fVar32;
              pVVar7 = pVVar12;
              if (1.0 <= fVar29) {
                fVar26 = 1.0 - fVar32;
                pVVar7 = pVVar1;
              }
              iVar16 = iVar16 + 1;
              uVar22 = -(uint)(fVar29 < 1.0);
              lVar17 = 0;
              do {
                fVar31 = pVVar13->m_data[lVar17];
                if (1.0 <= fVar29) {
                  fVar31 = pVVar13[-1].m_data[lVar17];
                }
                fVar33 = pVVar7->m_data[lVar17];
                *(float *)(local_d8.name._M_dataplus._M_p + (long)(iVar14 + (int)lVar17) * 4) =
                     ((float)(~uVar22 & (uint)pVVar13->m_data[lVar17] |
                             (uint)pVVar13[-1].m_data[lVar17] & uVar22) - fVar33) * fVar26 +
                     (fVar31 - fVar33) *
                     (float)(~uVar22 & (uint)(1.0 - fVar28) | uVar22 & (uint)fVar28) + fVar33;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              fVar29 = (float)iVar16 / (float)iVar9;
              fVar31 = fVar32 + fVar29;
              fVar26 = fVar32;
              pVVar7 = pVVar12;
              if (1.0 <= fVar31) {
                fVar26 = 1.0 - fVar32;
                pVVar7 = pVVar1;
              }
              uVar22 = -(uint)(fVar31 < 1.0);
              fVar33 = (float)(~uVar22 & (uint)(1.0 - fVar29) | uVar22 & (uint)fVar29);
              iVar14 = iVar14 + 4;
              lVar17 = 0;
              do {
                fVar30 = *(float *)((long)pVVar13[-1].m_data + lVar17);
                fVar27 = *(float *)((long)pVVar13->m_data + lVar17);
                fVar25 = fVar27;
                if (1.0 <= fVar31) {
                  fVar25 = fVar30;
                }
                fVar2 = *(float *)((long)pVVar7->m_data + lVar17);
                lVar18 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar18 * 4) =
                     ((float)(~uVar22 & (uint)fVar27 | (uint)fVar30 & uVar22) - fVar2) * fVar26 +
                     (fVar25 - fVar2) * fVar33 + fVar2;
                lVar17 = lVar17 + 4;
              } while (lVar17 != 0x10);
              fVar27 = fVar24 + fVar28;
              fVar30 = fVar24;
              pVVar8 = pVVar12;
              if (1.0 <= fVar27) {
                fVar28 = 1.0 - fVar28;
                fVar30 = 1.0 - fVar24;
                pVVar8 = pVVar1;
              }
              lVar17 = 0;
              do {
                fVar25 = pVVar13->m_data[lVar17];
                if (1.0 <= fVar27) {
                  fVar25 = pVVar13[-1].m_data[lVar17];
                }
                uVar23 = -(uint)(fVar27 < 1.0);
                fVar2 = pVVar8->m_data[lVar17];
                lVar18 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar18 * 4) =
                     ((float)(~uVar23 & (uint)pVVar13->m_data[lVar17] |
                             (uint)pVVar13[-1].m_data[lVar17] & uVar23) - fVar2) * fVar30 +
                     (fVar25 - fVar2) * fVar28 + fVar2;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                fVar25 = pVVar13->m_data[lVar17];
                if (1.0 <= fVar31) {
                  fVar25 = pVVar13[-1].m_data[lVar17];
                }
                fVar2 = pVVar7->m_data[lVar17];
                lVar18 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar18 * 4) =
                     ((float)(~uVar22 & (uint)pVVar13->m_data[lVar17] |
                             (uint)pVVar13[-1].m_data[lVar17] & uVar22) - fVar2) * fVar26 +
                     (fVar25 - fVar2) * fVar33 + fVar2;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              fVar31 = fVar24 + fVar29;
              fVar26 = fVar24;
              pVVar7 = pVVar12;
              if (1.0 <= fVar31) {
                fVar26 = 1.0 - fVar24;
                fVar29 = 1.0 - fVar29;
                pVVar7 = pVVar1;
              }
              lVar17 = 0;
              do {
                fVar33 = pVVar13->m_data[lVar17];
                if (1.0 <= fVar31) {
                  fVar33 = pVVar13[-1].m_data[lVar17];
                }
                fVar25 = pVVar7->m_data[lVar17];
                lVar18 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar18 * 4) =
                     ((float)(~-(uint)(fVar31 < 1.0) & (uint)pVVar13->m_data[lVar17] |
                             (uint)pVVar13[-1].m_data[lVar17] & -(uint)(fVar31 < 1.0)) - fVar25) *
                     fVar26 + (fVar33 - fVar25) * fVar29 + fVar25;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
              lVar17 = 0;
              do {
                fVar26 = pVVar13->m_data[lVar17];
                if (1.0 <= fVar27) {
                  fVar26 = pVVar13[-1].m_data[lVar17];
                }
                fVar29 = pVVar8->m_data[lVar17];
                lVar18 = (long)iVar14;
                iVar14 = iVar14 + 1;
                *(float *)(local_d8.name._M_dataplus._M_p + lVar18 * 4) =
                     ((float)(~uVar23 & (uint)pVVar13->m_data[lVar17] |
                             (uint)pVVar13[-1].m_data[lVar17] & uVar23) - fVar29) * fVar30 +
                     (fVar26 - fVar29) * fVar28 + fVar29;
                lVar17 = lVar17 + 1;
              } while (lVar17 != 4);
            } while (iVar16 != iVar9);
          }
          iVar15 = iVar15 + 1;
        } while (iVar15 != iVar3);
      }
      (**(code **)(lVar11 + 0x40))
                (0x8892,(this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar19]);
      (**(code **)(lVar11 + 0x150))
                (0x8892,local_d8.name._M_string_length - (long)local_d8.name._M_dataplus._M_p,
                 local_d8.name._M_dataplus._M_p,0x88e4);
      dVar10 = (**(code **)(lVar11 + 0x800))();
      glu::checkError(dVar10,"Upload buffer data",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                      ,0x28f);
      if (local_d8.name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_d8.name._M_dataplus._M_p,
                        local_d8.name.field_2._M_allocated_capacity -
                        (long)local_d8.name._M_dataplus._M_p);
      }
      uVar19 = uVar19 + 1;
      pVVar13 = pVVar13 + 6;
    } while (uVar19 != (uVar21 & 0x7fffffff));
    if (0 < (int)uVar21) {
      uVar19 = 0;
      pAVar20 = local_f0.
                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar9 = (**(code **)(lVar11 + 0x780))
                          ((pSVar4->m_program).m_program,(pAVar20->name)._M_dataplus._M_p);
        if (-1 < iVar9) {
          (**(code **)(lVar11 + 0x610))(iVar9);
          (**(code **)(lVar11 + 0x40))
                    (0x8892,(this_00->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[uVar19]);
          (**(code **)(lVar11 + 0x19f0))(iVar9,4,0x1406,0,0,0);
        }
        uVar19 = uVar19 + 1;
        pAVar20 = pAVar20 + 1;
      } while ((uVar21 & 0x7fffffff) != uVar19);
    }
  }
  dVar10 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar10,"Setup vertex input state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOperatorTests.cpp"
                  ,0x29e);
  (**(code **)(lVar11 + 0x1680))((pSVar4->m_program).m_program);
  (*(this->super_TestCase).super_TestNode._vptr_TestNode[6])
            (this,(ulong)(pSVar4->m_program).m_program);
  (**(code **)(lVar11 + 0x1a00))(0,0,this->m_viewportWidth,this->m_viewportHeight);
  std::
  vector<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
  ::~vector(&local_f0);
  return;
}

Assistant:

void OperatorPerformanceCase::prepareProgram (int progNdx)
{
	DE_ASSERT(progNdx < (int)m_programs.size());
	DE_ASSERT(m_programData.size() == m_programs.size());

	const glw::Functions&	gl			= m_renderCtx.getFunctions();
	const ShaderProgram&	program		= *m_programs[progNdx];

	vector<AttribSpec>		attributes	= m_programData[progNdx].attributes;

	attributes.push_back(AttribSpec("a_position",
									Vec4(-1.0f, -1.0f, 0.0f, 1.0f),
									Vec4( 1.0f, -1.0f, 0.0f, 1.0f),
									Vec4(-1.0f,  1.0f, 0.0f, 1.0f),
									Vec4( 1.0f,  1.0f, 0.0f, 1.0f)));

	DE_ASSERT(program.isOk());

	// Generate vertices.
	if (!m_attribBuffers.empty())
		gl.deleteBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	m_attribBuffers.resize(attributes.size(), 0);
	gl.genBuffers((glw::GLsizei)m_attribBuffers.size(), &m_attribBuffers[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers()");

	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		std::vector<float> vertices;
		generateVertices(vertices, m_gridSizeX, m_gridSizeY, attributes[attribNdx]);

		gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
		gl.bufferData(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(vertices.size()*sizeof(float)), &vertices[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Upload buffer data");
	}

	// Setup attribute bindings.
	for (int attribNdx = 0; attribNdx < (int)attributes.size(); attribNdx++)
	{
		int location = gl.getAttribLocation(program.getProgram(), attributes[attribNdx].name.c_str());

		if (location >= 0)
		{
			gl.enableVertexAttribArray(location);
			gl.bindBuffer(GL_ARRAY_BUFFER, m_attribBuffers[attribNdx]);
			gl.vertexAttribPointer(location, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
		}
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "Setup vertex input state");

	gl.useProgram(program.getProgram());
	setGeneralUniforms(program.getProgram());
	gl.viewport(0, 0, m_viewportWidth, m_viewportHeight);
}